

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

Database_Result * __thiscall
Database::Query(Database_Result *__return_storage_ptr__,Database *this,char *format,...)

{
  byte bVar1;
  char *__s;
  char in_AL;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  uint *puVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  undefined8 in_RCX;
  ulong uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  string finalquery;
  allocator<char> local_149;
  string local_148;
  ulong local_128;
  uint *local_120;
  undefined1 *local_118;
  char *local_110;
  undefined8 local_108;
  char local_100;
  undefined7 uStack_ff;
  Database_Result *local_f0;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_f0 = __return_storage_ptr__;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (this->connected == false) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar7[1] = "Not connected to database.";
    *puVar7 = &PTR__exception_001d3510;
    __cxa_throw(puVar7,&Database_QueryFailed::typeinfo,std::exception::~exception);
  }
  local_118 = local_e8;
  local_120 = (uint *)&stack0x00000008;
  local_128 = 0x3000000018;
  local_110 = &local_100;
  local_108 = 0;
  local_100 = '\0';
  pbVar9 = (byte *)format;
  do {
    bVar1 = *pbVar9;
    if (bVar1 < 0x24) {
      if (bVar1 == 0x23) {
        uVar8 = local_128 & 0xffffffff;
        if (uVar8 < 0x29) {
          local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
          puVar5 = (uint *)(local_118 + uVar8);
        }
        else {
          puVar5 = local_120;
          local_120 = local_120 + 2;
        }
        util::to_string_abi_cxx11_(&local_148,(util *)(ulong)*puVar5,(int)format);
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_148._M_dataplus._M_p);
        format = extraout_RDX_01;
        goto LAB_00131446;
      }
      if (bVar1 == 0) {
        RawQuery(local_f0,this,local_110,false);
        if (local_110 != &local_100) {
          operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
        }
        return local_f0;
      }
LAB_00131327:
      std::__cxx11::string::push_back((char)&local_110);
      format = extraout_RDX;
    }
    else if (bVar1 == 0x24) {
      uVar8 = local_128 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
        puVar5 = (uint *)(local_118 + uVar8);
      }
      else {
        puVar5 = local_120;
        local_120 = local_120 + 2;
      }
      __s = *(char **)puVar5;
      if (this->engine == SQLite) {
        uVar6 = sqlite3_mprintf("%q",__s);
        std::__cxx11::string::append((char *)&local_110);
        sqlite3_free(uVar6);
        format = extraout_RDX_04;
      }
      else if (this->engine == MySQL) {
        sVar2 = strlen(__s);
        pvVar3 = operator_new__((long)((int)sVar2 * 2 + 1));
        lVar4 = mysql_real_escape_string
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                            .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                           pvVar3,__s,(long)(int)sVar2);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,pvVar3,(long)pvVar3 + lVar4);
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        operator_delete__(pvVar3);
        format = extraout_RDX_00;
      }
    }
    else {
      if (bVar1 != 0x40) goto LAB_00131327;
      uVar8 = local_128 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
        puVar5 = (uint *)(local_118 + uVar8);
      }
      else {
        puVar5 = local_120;
        local_120 = local_120 + 2;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,*(char **)puVar5,&local_149);
      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_148._M_dataplus._M_p);
      format = extraout_RDX_02;
LAB_00131446:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        format = extraout_RDX_03;
      }
    }
    pbVar9 = pbVar9 + 1;
  } while( true );
}

Assistant:

Database_Result Database::Query(const char *format, ...)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::va_list ap;
	va_start(ap, format);

	std::string finalquery;
	int tempi;
	char *tempc;
	char *escret;
	unsigned long esclen;

	for (const char *p = format; *p != '\0'; ++p)
	{
		if (*p == '#')
		{
			tempi = va_arg(ap,int);
			finalquery += util::to_string(tempi);
		}
		else if (*p == '@')
		{
			tempc = va_arg(ap,char *);
			finalquery += static_cast<std::string>(tempc);
		}
		else if (*p == '$')
		{
			tempc = va_arg(ap,char *);
			switch (this->engine)
			{
#ifdef DATABASE_MYSQL
				case MySQL:
					tempi = strlen(tempc);
					escret = new char[tempi*2+1];
					esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, tempc, tempi);
					finalquery += std::string(escret, esclen);
					delete[] escret;
					break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
				case SQLite:
					escret = sqlite3_mprintf("%q",tempc);
					finalquery += escret;
					sqlite3_free(escret);
					break;
#endif // DATABASE_SQLITE
			}
		}
		else
		{
			finalquery += *p;
		}
	}

	va_end(ap);

	return this->RawQuery(finalquery.c_str());
}